

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O3

int AF_A_FireCGun(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  short sVar2;
  undefined8 *puVar3;
  player_t *this;
  AWeapon *this_00;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  void *pvVar7;
  FState *flashstate;
  FState *pFVar8;
  DPSprite *pDVar9;
  PClass *pPVar10;
  PClassActor *pufftype;
  uint uVar11;
  AActor *ent;
  VMValue *pVVar12;
  char *__assertion;
  bool bVar13;
  bool bVar14;
  FName local_48;
  FName local_44;
  FSoundID local_40;
  FName local_3c;
  
  pPVar10 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bd51b;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005bd4f9;
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_005bd2c6;
    pPVar6 = (ent->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar5 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
      (ent->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar13 = pPVar6 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar13;
    bVar14 = pPVar6 == pPVar10;
    if (!bVar14 && !bVar13) {
      do {
        pPVar6 = pPVar6->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
        if (pPVar6 == pPVar10) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005bd51b;
    }
    bVar4 = false;
    pVVar12 = (VMValue *)(ulong)(bVar14 || bVar13);
    uVar11 = (uint)bVar13;
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_005bd4f9;
LAB_005bd2c6:
    bVar4 = true;
    ent = (AActor *)0x0;
    pVVar12 = param;
    uVar11 = numparam;
  }
  pPVar10 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005bd4f9:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005bd51b;
      }
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar3 != (undefined8 *)0x0) {
          pPVar6 = (PClass *)puVar3[1];
          if (pPVar6 == (PClass *)0x0) {
            pPVar6 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar12,uVar11,ret);
            puVar3[1] = pPVar6;
          }
          bVar13 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar10 && bVar13) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar13 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar10) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          if (!bVar13) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005bd51b;
          }
        }
      }
      else if (puVar3 != (undefined8 *)0x0) goto LAB_005bd4f9;
    }
    if ((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar7 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_005bd38d;
        if (pvVar7 == (void *)0x0) goto LAB_005bd38b;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005bd51b:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x19e,"int AF_A_FireCGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_005bd38b:
  pvVar7 = (void *)0x0;
LAB_005bd38d:
  if ((!bVar4) && (this = ent->player, this != (player_t *)0x0)) {
    this_00 = this->ReadyWeapon;
    if ((pvVar7 != (void *)0x0 && this_00 != (AWeapon *)0x0) && (*(int *)((long)pvVar7 + 8) == 1)) {
      bVar13 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,1);
      if (!bVar13) {
        return 0;
      }
      local_40.ID = S_FindSound("weapons/chngun");
      S_Sound(ent,1,&local_40,1.0,1.0);
      local_44.Index = 0xa3;
      flashstate = AActor::FindState((AActor *)this_00,&local_44);
      if (flashstate != (FState *)0x0) {
        local_48.Index = 0x9f;
        pFVar8 = AActor::FindState((AActor *)this_00,&local_48);
        pDVar9 = player_t::GetPSprite(this,PSP_WEAPON);
        bVar13 = 0 < (int)((ulong)((long)pDVar9->State - (long)pFVar8) >> 3) * -0x33333333;
        P_SetSafeFlash(this_00,this,flashstate,
                       (uint)(bVar13 && flashstate[bVar13].sprite == flashstate->sprite));
      }
    }
    APlayerPawn::PlayAttacking2(this->mo);
    sVar2 = this->refire;
    local_3c.Index = 0x40;
    pPVar10 = PClass::FindClass(&local_3c);
    pufftype = dyn_cast<PClassActor>((DObject *)pPVar10);
    P_BulletSlope((AActor *)&stack0xffffffffffffffc8,(FTranslatedLineTarget *)ent,0);
    P_GunShot(ent,sVar2 == 0,pufftype,(DAngle *)&stack0xffffffffffffffc8);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireCGun)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player;

	if (self == nullptr || nullptr == (player = self->player))
	{
		return 0;
	}

	AWeapon *weapon = player->ReadyWeapon;
	if (weapon != nullptr && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
			return 0;
		
		S_Sound (self, CHAN_WEAPON, "weapons/chngun", 1, ATTN_NORM);

		FState *flash = weapon->FindState(NAME_Flash);
		if (flash != nullptr)
		{
			// [RH] Fix for Sparky's messed-up Dehacked patch! Blargh!
			FState * atk = weapon->FindState(NAME_Fire);

			int theflash = clamp (int(player->GetPSprite(PSP_WEAPON)->GetState() - atk), 0, 1);

			if (flash[theflash].sprite != flash->sprite)
			{
				theflash = 0;
			}

			P_SetSafeFlash (weapon, player, flash, theflash);
		}

	}
	player->mo->PlayAttacking2 ();

	P_GunShot (self, !player->refire, PClass::FindActor(NAME_BulletPuff), P_BulletSlope (self));
	return 0;
}